

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_reader.cpp
# Opt level: O0

void __thiscall
charls::jpeg_stream_reader::validate_marker_code
          (jpeg_stream_reader *this,jpeg_marker_code marker_code)

{
  bool bVar1;
  jpeg_marker_code marker_code_local;
  jpeg_stream_reader *this_local;
  
  switch(marker_code) {
  case start_of_frame_baseline_jpeg:
  case start_of_frame_extended_sequential:
  case start_of_frame_progressive:
  case start_of_frame_lossless:
  case start_of_frame_differential_sequential:
  case start_of_frame_differential_progressive:
  case start_of_frame_differential_lossless:
  case start_of_frame_extended_arithmetic:
  case start_of_frame_progressive_arithmetic:
  case start_of_frame_lossless_arithmetic:
  case start_of_frame_jpegls_extended:
    impl::throw_jpegls_error(UnsupportedEncoding);
  default:
    bVar1 = anon_unknown_20::is_restart_marker_code(marker_code);
    if (!bVar1) {
      impl::throw_jpegls_error(UnknownJpegMarker);
    }
    impl::throw_jpegls_error(unexpected_restart_marker);
  case start_of_image:
    impl::throw_jpegls_error(duplicate_start_of_image_marker);
  case end_of_image:
    impl::throw_jpegls_error(unexpected_end_of_image_marker);
  case start_of_scan:
    if (this->state_ != scan_section) {
      impl::throw_jpegls_error(unexpected_marker_found);
    }
    break;
  case define_restart_interval:
  case application_data0:
  case application_data1:
  case application_data2:
  case application_data3:
  case application_data4:
  case application_data5:
  case application_data6:
  case application_data7:
  case application_data8:
  case application_data9:
  case application_data10:
  case application_data11:
  case application_data12:
  case application_data13:
  case application_data14:
  case application_data15:
  case jpegls_preset_parameters:
  case comment:
    break;
  case start_of_frame_jpegls:
    if (this->state_ == scan_section) {
      impl::throw_jpegls_error(duplicate_start_of_frame_marker);
    }
  }
  return;
}

Assistant:

void jpeg_stream_reader::validate_marker_code(const jpeg_marker_code marker_code) const
{
    // ISO/IEC 14495-1, C.1.1. defines the following markers as valid for a JPEG-LS byte stream:
    // SOF55, LSE, SOI, EOI, SOS, DNL, DRI, RSTm, APPn and COM.
    // All other markers shall not be present.
    switch (marker_code)
    {
    case jpeg_marker_code::start_of_scan:
        if (UNLIKELY(state_ != state::scan_section))
            throw_jpegls_error(jpegls_errc::unexpected_marker_found);

        return;

    case jpeg_marker_code::start_of_frame_jpegls:
        if (UNLIKELY(state_ == state::scan_section))
            throw_jpegls_error(jpegls_errc::duplicate_start_of_frame_marker);

        return;

    case jpeg_marker_code::define_restart_interval:
    case jpeg_marker_code::jpegls_preset_parameters:
    case jpeg_marker_code::comment:
    case jpeg_marker_code::application_data0:
    case jpeg_marker_code::application_data1:
    case jpeg_marker_code::application_data2:
    case jpeg_marker_code::application_data3:
    case jpeg_marker_code::application_data4:
    case jpeg_marker_code::application_data5:
    case jpeg_marker_code::application_data6:
    case jpeg_marker_code::application_data7:
    case jpeg_marker_code::application_data8:
    case jpeg_marker_code::application_data9:
    case jpeg_marker_code::application_data10:
    case jpeg_marker_code::application_data11:
    case jpeg_marker_code::application_data12:
    case jpeg_marker_code::application_data13:
    case jpeg_marker_code::application_data14:
    case jpeg_marker_code::application_data15:
        return;

    // Check explicit for one of the other common JPEG encodings.
    case jpeg_marker_code::start_of_frame_baseline_jpeg:
    case jpeg_marker_code::start_of_frame_extended_sequential:
    case jpeg_marker_code::start_of_frame_progressive:
    case jpeg_marker_code::start_of_frame_lossless:
    case jpeg_marker_code::start_of_frame_differential_sequential:
    case jpeg_marker_code::start_of_frame_differential_progressive:
    case jpeg_marker_code::start_of_frame_differential_lossless:
    case jpeg_marker_code::start_of_frame_extended_arithmetic:
    case jpeg_marker_code::start_of_frame_progressive_arithmetic:
    case jpeg_marker_code::start_of_frame_lossless_arithmetic:
    case jpeg_marker_code::start_of_frame_jpegls_extended:
        throw_jpegls_error(jpegls_errc::encoding_not_supported);

    case jpeg_marker_code::start_of_image:
        throw_jpegls_error(jpegls_errc::duplicate_start_of_image_marker);

    case jpeg_marker_code::end_of_image:
        throw_jpegls_error(jpegls_errc::unexpected_end_of_image_marker);
    }

    if (is_restart_marker_code(marker_code))
        throw_jpegls_error(jpegls_errc::unexpected_restart_marker);

    throw_jpegls_error(jpegls_errc::unknown_jpeg_marker_found);
}